

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O2

void ZXing::SaveAsPBM(BitMatrix *matrix,string *filename,int quietZone)

{
  ostream *poVar1;
  Matrix<unsigned_char> out;
  BitMatrix local_238;
  ofstream file;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_210 [21];
  
  BitMatrix::BitMatrix(&local_238,matrix);
  Inflate((BitMatrix *)&file,&local_238,0,0,quietZone);
  ToMatrix<unsigned_char>(&out,(BitMatrix *)&file,'\0',0xff);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(local_210);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_238._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::ofstream::ofstream(&file,(string *)filename,_S_out);
  poVar1 = std::operator<<((ostream *)&file,"P5\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,out._width);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,out._height);
  std::operator<<(poVar1,"\n255\n");
  std::ostream::write((char *)&file,
                      (long)out._data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  std::ofstream::~ofstream(&file);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&out._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void SaveAsPBM(const BitMatrix& matrix, const std::string filename, int quietZone)
{
	auto out = ToMatrix<uint8_t>(Inflate(matrix.copy(), 0, 0, quietZone));
	std::ofstream file(filename);
	file << "P5\n" << out.width() << ' ' << out.height() << "\n255\n";
	file.write(reinterpret_cast<const char*>(out.data()), out.size());
}